

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O1

bool __thiscall
llvm::
DenseMapBase<llvm::DenseMap<llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>,_llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>
::LookupBucketFor<llvm::StringRef>
          (DenseMapBase<llvm::DenseMap<llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>,_llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>
           *this,StringRef *Val,DenseSetPair<llvm::StringRef> **FoundBucket)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  StringRef *pSVar6;
  byte bVar7;
  uint uVar8;
  StringRef RHS;
  StringRef *local_40;
  int local_38;
  uint uVar9;
  
  iVar1 = *(int *)(this + 0x10);
  if (iVar1 == 0) {
    *FoundBucket = (DenseSetPair<llvm::StringRef> *)0x0;
    bVar7 = 0;
  }
  else {
    lVar2 = *(long *)this;
    bVar3 = DenseMapInfo<llvm::StringRef>::isEqual(*Val,(StringRef)ZEXT816(0xffffffffffffffff));
    if ((bVar3) ||
       (bVar3 = DenseMapInfo<llvm::StringRef>::isEqual(*Val,(StringRef)ZEXT816(0xfffffffffffffffe)),
       bVar3)) {
      __assert_fail("!KeyInfoT::isEqual(Val, EmptyKey) && !KeyInfoT::isEqual(Val, TombstoneKey) && \"Empty/Tombstone value shouldn\'t be inserted into map!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMap.h"
                    ,0x24d,
                    "bool llvm::DenseMapBase<llvm::DenseMap<llvm::StringRef, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<StringRef>, llvm::detail::DenseSetPair<llvm::StringRef>>, llvm::StringRef, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<StringRef>, llvm::detail::DenseSetPair<llvm::StringRef>>::LookupBucketFor(const LookupKeyT &, const BucketT *&) const [DerivedT = llvm::DenseMap<llvm::StringRef, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<StringRef>, llvm::detail::DenseSetPair<llvm::StringRef>>, KeyT = llvm::StringRef, ValueT = llvm::detail::DenseSetEmpty, KeyInfoT = llvm::DenseMapInfo<StringRef>, BucketT = llvm::detail::DenseSetPair<llvm::StringRef>, LookupKeyT = llvm::StringRef]"
                   );
    }
    uVar4 = DenseMapInfo<llvm::StringRef>::getHashValue(*Val);
    uVar8 = iVar1 - 1;
    uVar4 = uVar4 & uVar8;
    local_38 = 1;
    local_40 = (StringRef *)0x0;
    uVar9 = uVar8;
    do {
      lVar5 = (ulong)uVar4 * 0x10;
      pSVar6 = (StringRef *)(lVar5 + lVar2);
      RHS.Length = *(size_t *)(lVar2 + 8 + lVar5);
      RHS.Data = *(char **)(lVar2 + lVar5);
      bVar3 = DenseMapInfo<llvm::StringRef>::isEqual(*Val,RHS);
      if (bVar3) {
        *FoundBucket = (DenseSetPair<llvm::StringRef> *)pSVar6;
        uVar9 = 1;
        bVar3 = false;
      }
      else {
        bVar3 = DenseMapInfo<llvm::StringRef>::isEqual
                          (*pSVar6,(StringRef)ZEXT816(0xffffffffffffffff));
        if (bVar3) {
          if (local_40 != (StringRef *)0x0) {
            pSVar6 = local_40;
          }
          *FoundBucket = (DenseSetPair<llvm::StringRef> *)pSVar6;
          bVar3 = false;
          uVar9 = 0;
        }
        else {
          bVar3 = DenseMapInfo<llvm::StringRef>::isEqual
                            (*pSVar6,(StringRef)ZEXT816(0xfffffffffffffffe));
          if (local_40 != (StringRef *)0x0) {
            pSVar6 = local_40;
          }
          if (bVar3) {
            local_40 = pSVar6;
          }
          uVar4 = uVar4 + local_38;
          local_38 = local_38 + 1;
          uVar4 = uVar4 & uVar8;
          bVar3 = true;
        }
      }
      bVar7 = (byte)uVar9;
    } while (bVar3);
  }
  return (bool)(bVar7 & 1);
}

Assistant:

bool LookupBucketFor(const LookupKeyT &Val,
                       const BucketT *&FoundBucket) const {
    const BucketT *BucketsPtr = getBuckets();
    const unsigned NumBuckets = getNumBuckets();

    if (NumBuckets == 0) {
      FoundBucket = nullptr;
      return false;
    }

    // FoundTombstone - Keep track of whether we find a tombstone while probing.
    const BucketT *FoundTombstone = nullptr;
    const KeyT EmptyKey = getEmptyKey();
    const KeyT TombstoneKey = getTombstoneKey();
    assert(!KeyInfoT::isEqual(Val, EmptyKey) &&
           !KeyInfoT::isEqual(Val, TombstoneKey) &&
           "Empty/Tombstone value shouldn't be inserted into map!");

    unsigned BucketNo = getHashValue(Val) & (NumBuckets-1);
    unsigned ProbeAmt = 1;
    while (true) {
      const BucketT *ThisBucket = BucketsPtr + BucketNo;
      // Found Val's bucket?  If so, return it.
      if (LLVM_LIKELY(KeyInfoT::isEqual(Val, ThisBucket->getFirst()))) {
        FoundBucket = ThisBucket;
        return true;
      }

      // If we found an empty bucket, the key doesn't exist in the set.
      // Insert it and return the default value.
      if (LLVM_LIKELY(KeyInfoT::isEqual(ThisBucket->getFirst(), EmptyKey))) {
        // If we've already seen a tombstone while probing, fill it in instead
        // of the empty bucket we eventually probed to.
        FoundBucket = FoundTombstone ? FoundTombstone : ThisBucket;
        return false;
      }

      // If this is a tombstone, remember it.  If Val ends up not in the map, we
      // prefer to return it than something that would require more probing.
      if (KeyInfoT::isEqual(ThisBucket->getFirst(), TombstoneKey) &&
          !FoundTombstone)
        FoundTombstone = ThisBucket;  // Remember the first tombstone found.

      // Otherwise, it's a hash collision or a tombstone, continue quadratic
      // probing.
      BucketNo += ProbeAmt++;
      BucketNo &= (NumBuckets-1);
    }
  }